

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.h
# Opt level: O1

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::AddStartState::operator()
          (AddStartState *this,iterator_t *str,iterator_t *end)

{
  ParserDPOMDPFormat_Spirit *pPVar1;
  iterator __position;
  ostream *poVar2;
  undefined8 *puVar3;
  E e;
  stringstream ss;
  Index local_1b0 [4];
  ostream local_1a0 [376];
  
  pPVar1 = this->_m_po;
  if (pPVar1->_m_lp_type == STRING) {
    local_1b0[0] = MADPComponentDiscreteStates::GetStateIndexByName
                             (&(pPVar1->_m_decPOMDPDiscrete->super_MultiAgentDecisionProcessDiscrete
                               )._m_S,&pPVar1->_m_lp_string);
    pPVar1 = this->_m_po;
    __position._M_current =
         (pPVar1->_m_startStateListSI).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pPVar1->_m_startStateListSI).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pPVar1->_m_startStateListSI,
                 __position,local_1b0);
    }
    else {
      *__position._M_current = local_1b0[0];
      (pPVar1->_m_startStateListSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a0,
             "SetStartState::operator()(iterator_t str, iterator_t end) - expected a string as last parsed type! (at"
             ,0x66);
  poVar2 = DPOMDPFormatParsing::operator<<(local_1a0,&str->_pos);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::endl<char,std::char_traits<char>>(poVar2);
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar3 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  __cxa_throw(puVar3,&E::typeinfo,E::~E);
}

Assistant:

void operator()(iterator_t str, iterator_t end) const
            {
                if(_m_po->_m_lp_type != STRING)
                {
                    std::stringstream ss; ss << "SetStartState::operator()(iterator_t str, iterator_t end) - expected a string as last parsed type! (at"<<str.get_position() <<")"<<std::endl;
                    throw E(ss);
                }
                try
                {
                    Index sI = _m_po->GetDecPOMDPDiscrete()->GetStateIndexByName(
                            _m_po->_m_lp_string);
                    _m_po->_m_startStateListSI.push_back(sI);
                }
                catch(E e)
                {
                    std::stringstream ss; ss << e.SoftPrint() << "(at"<<
                        str.get_position() <<")"<<std::endl;
                    throw E(ss);
                }
            }